

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# displacement_geometry_device.cpp
# Opt level: O2

float embree::displacement_dv(Vec3fa *P,Vec3fa *dPdv)

{
  float fVar1;
  float fVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_18;
  
  local_18.m128[0] = (dPdv->field_0).m128[0] * 0.001 + (P->field_0).m128[0];
  local_18.m128[1] = (dPdv->field_0).m128[1] * 0.001 + (P->field_0).m128[1];
  local_18.m128[2] = (dPdv->field_0).m128[2] * 0.001 + (P->field_0).m128[2];
  local_18.m128[3] = (dPdv->field_0).m128[3] * 0.001 + (P->field_0).m128[3];
  fVar1 = displacement((Vec3fa *)&local_18.field_1);
  fVar2 = displacement(P);
  return (fVar1 - fVar2) / 0.001;
}

Assistant:

float displacement_dv(const Vec3fa& P, const Vec3fa& dPdv)
{
  const float dv = 0.001f;
  return (displacement(P+dv*dPdv)-displacement(P))/dv;
}